

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O0

raw_os_ostream * getInstName_abi_cxx11_(Value *val)

{
  bool bVar1;
  raw_ostream *this;
  raw_os_ostream *in_RDI;
  raw_os_ostream ro;
  ostringstream ostr;
  Value *in_stack_fffffffffffffe08;
  raw_os_ostream *Str;
  raw_os_ostream local_1d0 [72];
  ostringstream local_188 [392];
  
  Str = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  llvm::raw_os_ostream::raw_os_ostream(in_RDI,(ostream *)in_stack_fffffffffffffe08);
  bVar1 = llvm::isa<llvm::Function,llvm::Value_const*>((Value **)0x14ea4a);
  if (bVar1) {
    this = (raw_ostream *)llvm::Value::getName();
    llvm::StringRef::data((StringRef *)&stack0xfffffffffffffe20);
    llvm::raw_ostream::operator<<(this,(char *)Str);
  }
  else {
    llvm::operator<<((raw_ostream *)in_RDI,in_stack_fffffffffffffe08);
  }
  llvm::raw_ostream::flush((raw_ostream *)in_RDI);
  std::__cxx11::ostringstream::str();
  llvm::raw_os_ostream::~raw_os_ostream(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return Str;
}

Assistant:

static std::string getInstName(const llvm::Value *val) {
    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    assert(val);
    if (llvm::isa<llvm::Function>(val))
        ro << val->getName().data();
    else
        ro << *val;

    ro.flush();

    // break the string if it is too long
    return ostr.str();
}